

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lf_queue_tail_multiple_seq_cst.h
# Opt level: O0

ControlBlock * __thiscall
density::detail::
LFQueue_Tail<density_tests::TestRuntimeTime<density::runtime_type<density::feature_list<density::f_size,_density::f_alignment,_density::f_copy_construct,_density::f_move_construct,_density::f_rtti,_density::f_destroy>_>_>,_density_tests::DeepTestAllocator<65536UL>,_(density::concurrency_cardinality)1,_(density::consistency_model)1>
::get_or_allocate_next_page
          (LFQueue_Tail<density_tests::TestRuntimeTime<density::runtime_type<density::feature_list<density::f_size,_density::f_alignment,_density::f_copy_construct,_density::f_move_construct,_density::f_rtti,_density::f_destroy>_>_>,_density_tests::DeepTestAllocator<65536UL>,_(density::concurrency_cardinality)1,_(density::consistency_model)1>
           *this,LfQueue_ProgressGuarantee i_progress_guarantee,ControlBlock *i_end_control)

{
  LFQueue_Tail<density_tests::TestRuntimeTime<density::runtime_type<density::feature_list<density::f_size,_density::f_alignment,_density::f_copy_construct,_density::f_move_construct,_density::f_rtti,_density::f_destroy>_>_>,_density_tests::DeepTestAllocator<65536UL>,_(density::concurrency_cardinality)1,_(density::consistency_model)1>
  *pLVar1;
  void *pvVar2;
  bool bVar3;
  memory_order mVar4;
  LFQueue_Tail<density_tests::TestRuntimeTime<density::runtime_type<density::feature_list<density::f_size,_density::f_alignment,_density::f_copy_construct,_density::f_move_construct,_density::f_rtti,_density::f_destroy>_>_>,_density_tests::DeepTestAllocator<65536UL>,_(density::concurrency_cardinality)1,_(density::consistency_model)1>
  *pLVar5;
  ControlBlock *pCVar6;
  atomic<unsigned_long> *paVar7;
  LFQueue_Tail<density_tests::TestRuntimeTime<density::runtime_type<density::feature_list<density::f_size,_density::f_alignment,_density::f_copy_construct,_density::f_move_construct,_density::f_rtti,_density::f_destroy>_>_>,_density_tests::DeepTestAllocator<65536UL>,_(density::concurrency_cardinality)1,_(density::consistency_model)1>
  *local_d8;
  uintptr_t expected_tail;
  uintptr_t expected_next;
  LFQueue_Tail<density_tests::TestRuntimeTime<density::runtime_type<density::feature_list<density::f_size,_density::f_alignment,_density::f_copy_construct,_density::f_move_construct,_density::f_rtti,_density::f_destroy>_>_>,_density_tests::DeepTestAllocator<65536UL>,_(density::concurrency_cardinality)1,_(density::consistency_model)1>
  *local_b8;
  ControlBlock *new_page;
  ControlBlock *updated_tail;
  undefined1 local_a0 [4];
  PinResult pin_result;
  PinGuard<density_tests::DeepTestAllocator<65536UL>,_(density::progress_guarantee)2> end_block;
  ControlBlock *i_end_control_local;
  LfQueue_ProgressGuarantee i_progress_guarantee_local;
  LFQueue_Tail<density_tests::TestRuntimeTime<density::runtime_type<density::feature_list<density::f_size,_density::f_alignment,_density::f_copy_construct,_density::f_move_construct,_density::f_rtti,_density::f_destroy>_>_>,_density_tests::DeepTestAllocator<65536UL>,_(density::concurrency_cardinality)1,_(density::consistency_model)1>
  *this_local;
  memory_order __b;
  
  end_block.m_pinned_page = i_end_control;
  if (((i_end_control == (ControlBlock *)0x0) ||
      (bVar3 = address_is_aligned(i_end_control,0x40), pvVar2 = end_block.m_pinned_page, !bVar3)) ||
     (pCVar6 = LFQueue_Base<density_tests::TestRuntimeTime<density::runtime_type<density::feature_list<density::f_size,_density::f_alignment,_density::f_copy_construct,_density::f_move_construct,_density::f_rtti,_density::f_destroy>_>_>,_density_tests::DeepTestAllocator<65536UL>,_density::detail::LFQueue_Tail<density_tests::TestRuntimeTime<density::runtime_type<density::feature_list<density::f_size,_density::f_alignment,_density::f_copy_construct,_density::f_move_construct,_density::f_rtti,_density::f_destroy>_>_>,_density_tests::DeepTestAllocator<65536UL>,_(density::concurrency_cardinality)1,_(density::consistency_model)1>_>
               ::get_end_control_block(end_block.m_pinned_page), (ControlBlock *)pvVar2 != pCVar6))
  {
    density_tests::detail::assert_failed<>
              ("i_end_control != 0 && address_is_aligned(i_end_control, s_alloc_granularity) && i_end_control == get_end_control_block(i_end_control)"
               ,
               "/workspace/llm4binary/github/license_c_cmakelists/giucamp[P]density/include/density/detail/lf_queue_tail_multiple_seq_cst.h"
               ,0x15c);
  }
  if (end_block.m_pinned_page == (void *)0xffc0) {
    pCVar6 = create_initial_page(this,i_progress_guarantee);
    return pCVar6;
  }
  PinGuard<density_tests::DeepTestAllocator<65536UL>,_(density::progress_guarantee)2>::PinGuard
            ((PinGuard<density_tests::DeepTestAllocator<65536UL>,_(density::progress_guarantee)2> *)
             local_a0,(DeepTestAllocator<65536UL> *)this);
  updated_tail._4_4_ =
       PinGuard<density_tests::DeepTestAllocator<65536UL>,_(density::progress_guarantee)2>::pin
                 ((PinGuard<density_tests::DeepTestAllocator<65536UL>,_(density::progress_guarantee)2>
                   *)local_a0,end_block.m_pinned_page);
  if (updated_tail._4_4_ == PinFailed) {
    this_local = (LFQueue_Tail<density_tests::TestRuntimeTime<density::runtime_type<density::feature_list<density::f_size,_density::f_alignment,_density::f_copy_construct,_density::f_move_construct,_density::f_rtti,_density::f_destroy>_>_>,_density_tests::DeepTestAllocator<65536UL>,_(density::concurrency_cardinality)1,_(density::consistency_model)1>
                  *)0x0;
  }
  else {
    std::operator&(memory_order_seq_cst,__memory_order_mask);
    new_page = (ControlBlock *)(this->m_tail).super___atomic_base<unsigned_long>._M_i;
    this_local = (LFQueue_Tail<density_tests::TestRuntimeTime<density::runtime_type<density::feature_list<density::f_size,_density::f_alignment,_density::f_copy_construct,_density::f_move_construct,_density::f_rtti,_density::f_destroy>_>_>,_density_tests::DeepTestAllocator<65536UL>,_(density::concurrency_cardinality)1,_(density::consistency_model)1>
                  *)new_page;
    if (new_page == (ControlBlock *)end_block.m_pinned_page) {
      local_b8 = (LFQueue_Tail<density_tests::TestRuntimeTime<density::runtime_type<density::feature_list<density::f_size,_density::f_alignment,_density::f_copy_construct,_density::f_move_construct,_density::f_rtti,_density::f_destroy>_>_>,_density_tests::DeepTestAllocator<65536UL>,_(density::concurrency_cardinality)1,_(density::consistency_model)1>
                  *)create_page(this,i_progress_guarantee);
      if (local_b8 ==
          (LFQueue_Tail<density_tests::TestRuntimeTime<density::runtime_type<density::feature_list<density::f_size,_density::f_alignment,_density::f_copy_construct,_density::f_move_construct,_density::f_rtti,_density::f_destroy>_>_>,_density_tests::DeepTestAllocator<65536UL>,_(density::concurrency_cardinality)1,_(density::consistency_model)1>
           *)0x0) {
        this_local = (LFQueue_Tail<density_tests::TestRuntimeTime<density::runtime_type<density::feature_list<density::f_size,_density::f_alignment,_density::f_copy_construct,_density::f_move_construct,_density::f_rtti,_density::f_destroy>_>_>,_density_tests::DeepTestAllocator<65536UL>,_(density::concurrency_cardinality)1,_(density::consistency_model)1>
                      *)0x0;
      }
      else {
        expected_tail = 8;
        bVar3 = raw_atomic_compare_exchange_strong<unsigned_long>
                          ((unsigned_long *)end_block.m_pinned_page,&expected_tail,
                           (unsigned_long)
                           ((long)&(local_b8->
                                   super_LFQueue_Base<density_tests::TestRuntimeTime<density::runtime_type<density::feature_list<density::f_size,_density::f_alignment,_density::f_copy_construct,_density::f_move_construct,_density::f_rtti,_density::f_destroy>_>_>,_density_tests::DeepTestAllocator<65536UL>,_density::detail::LFQueue_Tail<density_tests::TestRuntimeTime<density::runtime_type<density::feature_list<density::f_size,_density::f_alignment,_density::f_copy_construct,_density::f_move_construct,_density::f_rtti,_density::f_destroy>_>_>,_density_tests::DeepTestAllocator<65536UL>,_(density::concurrency_cardinality)1,_(density::consistency_model)1>_>
                                   ).super_DeepTestAllocator<65536UL>.m_registry.m_data.
                                   super___shared_ptr<density_tests::SharedBlockRegistry::Data,_(__gnu_cxx::_Lock_policy)2>
                                   ._M_ptr + 2),memory_order_seq_cst);
        if (!bVar3) {
          discard_created_page(this,(ControlBlock *)local_b8);
          if (expected_tail == 0) {
            this_local = (LFQueue_Tail<density_tests::TestRuntimeTime<density::runtime_type<density::feature_list<density::f_size,_density::f_alignment,_density::f_copy_construct,_density::f_move_construct,_density::f_rtti,_density::f_destroy>_>_>,_density_tests::DeepTestAllocator<65536UL>,_(density::concurrency_cardinality)1,_(density::consistency_model)1>
                          *)new_page;
            goto LAB_026e2af1;
          }
          local_b8 = (LFQueue_Tail<density_tests::TestRuntimeTime<density::runtime_type<density::feature_list<density::f_size,_density::f_alignment,_density::f_copy_construct,_density::f_move_construct,_density::f_rtti,_density::f_destroy>_>_>,_density_tests::DeepTestAllocator<65536UL>,_(density::concurrency_cardinality)1,_(density::consistency_model)1>
                      *)(expected_tail & 0xfffffffffffffff0);
          if (local_b8 ==
              (LFQueue_Tail<density_tests::TestRuntimeTime<density::runtime_type<density::feature_list<density::f_size,_density::f_alignment,_density::f_copy_construct,_density::f_move_construct,_density::f_rtti,_density::f_destroy>_>_>,_density_tests::DeepTestAllocator<65536UL>,_(density::concurrency_cardinality)1,_(density::consistency_model)1>
               *)0x0) {
            density_tests::detail::assert_failed<>
                      ("new_page != nullptr",
                       "/workspace/llm4binary/github/license_c_cmakelists/giucamp[P]density/include/density/detail/lf_queue_tail_multiple_seq_cst.h"
                       ,0x18b);
          }
        }
        pvVar2 = end_block.m_pinned_page;
        pLVar1 = local_b8;
        local_d8 = (LFQueue_Tail<density_tests::TestRuntimeTime<density::runtime_type<density::feature_list<density::f_size,_density::f_alignment,_density::f_copy_construct,_density::f_move_construct,_density::f_rtti,_density::f_destroy>_>_>,_density_tests::DeepTestAllocator<65536UL>,_(density::concurrency_cardinality)1,_(density::consistency_model)1>
                    *)end_block.m_pinned_page;
        paVar7 = &this->m_tail;
        mVar4 = std::__cmpexch_failure_order(memory_order_seq_cst);
        switch(0x26e25c3) {
        default:
          if (mVar4 - memory_order_consume < 2) {
            LOCK();
            pLVar5 = (LFQueue_Tail<density_tests::TestRuntimeTime<density::runtime_type<density::feature_list<density::f_size,_density::f_alignment,_density::f_copy_construct,_density::f_move_construct,_density::f_rtti,_density::f_destroy>_>_>,_density_tests::DeepTestAllocator<65536UL>,_(density::concurrency_cardinality)1,_(density::consistency_model)1>
                      *)(paVar7->super___atomic_base<unsigned_long>)._M_i;
            bVar3 = (LFQueue_Tail<density_tests::TestRuntimeTime<density::runtime_type<density::feature_list<density::f_size,_density::f_alignment,_density::f_copy_construct,_density::f_move_construct,_density::f_rtti,_density::f_destroy>_>_>,_density_tests::DeepTestAllocator<65536UL>,_(density::concurrency_cardinality)1,_(density::consistency_model)1>
                     *)pvVar2 == pLVar5;
            if (bVar3) {
              (paVar7->super___atomic_base<unsigned_long>)._M_i = (__int_type)pLVar1;
              pLVar5 = (LFQueue_Tail<density_tests::TestRuntimeTime<density::runtime_type<density::feature_list<density::f_size,_density::f_alignment,_density::f_copy_construct,_density::f_move_construct,_density::f_rtti,_density::f_destroy>_>_>,_density_tests::DeepTestAllocator<65536UL>,_(density::concurrency_cardinality)1,_(density::consistency_model)1>
                        *)pvVar2;
            }
            UNLOCK();
            if (!bVar3) {
              local_d8 = pLVar5;
            }
          }
          else if (mVar4 == memory_order_seq_cst) {
            LOCK();
            pLVar5 = (LFQueue_Tail<density_tests::TestRuntimeTime<density::runtime_type<density::feature_list<density::f_size,_density::f_alignment,_density::f_copy_construct,_density::f_move_construct,_density::f_rtti,_density::f_destroy>_>_>,_density_tests::DeepTestAllocator<65536UL>,_(density::concurrency_cardinality)1,_(density::consistency_model)1>
                      *)(paVar7->super___atomic_base<unsigned_long>)._M_i;
            bVar3 = (LFQueue_Tail<density_tests::TestRuntimeTime<density::runtime_type<density::feature_list<density::f_size,_density::f_alignment,_density::f_copy_construct,_density::f_move_construct,_density::f_rtti,_density::f_destroy>_>_>,_density_tests::DeepTestAllocator<65536UL>,_(density::concurrency_cardinality)1,_(density::consistency_model)1>
                     *)pvVar2 == pLVar5;
            if (bVar3) {
              (paVar7->super___atomic_base<unsigned_long>)._M_i = (__int_type)pLVar1;
              pLVar5 = (LFQueue_Tail<density_tests::TestRuntimeTime<density::runtime_type<density::feature_list<density::f_size,_density::f_alignment,_density::f_copy_construct,_density::f_move_construct,_density::f_rtti,_density::f_destroy>_>_>,_density_tests::DeepTestAllocator<65536UL>,_(density::concurrency_cardinality)1,_(density::consistency_model)1>
                        *)pvVar2;
            }
            UNLOCK();
            if (!bVar3) {
              local_d8 = pLVar5;
            }
          }
          else {
            LOCK();
            pLVar5 = (LFQueue_Tail<density_tests::TestRuntimeTime<density::runtime_type<density::feature_list<density::f_size,_density::f_alignment,_density::f_copy_construct,_density::f_move_construct,_density::f_rtti,_density::f_destroy>_>_>,_density_tests::DeepTestAllocator<65536UL>,_(density::concurrency_cardinality)1,_(density::consistency_model)1>
                      *)(paVar7->super___atomic_base<unsigned_long>)._M_i;
            bVar3 = (LFQueue_Tail<density_tests::TestRuntimeTime<density::runtime_type<density::feature_list<density::f_size,_density::f_alignment,_density::f_copy_construct,_density::f_move_construct,_density::f_rtti,_density::f_destroy>_>_>,_density_tests::DeepTestAllocator<65536UL>,_(density::concurrency_cardinality)1,_(density::consistency_model)1>
                     *)pvVar2 == pLVar5;
            if (bVar3) {
              (paVar7->super___atomic_base<unsigned_long>)._M_i = (__int_type)pLVar1;
              pLVar5 = (LFQueue_Tail<density_tests::TestRuntimeTime<density::runtime_type<density::feature_list<density::f_size,_density::f_alignment,_density::f_copy_construct,_density::f_move_construct,_density::f_rtti,_density::f_destroy>_>_>,_density_tests::DeepTestAllocator<65536UL>,_(density::concurrency_cardinality)1,_(density::consistency_model)1>
                        *)pvVar2;
            }
            UNLOCK();
            if (!bVar3) {
              local_d8 = pLVar5;
            }
          }
          break;
        case 2:
          if (mVar4 - memory_order_consume < 2) {
            LOCK();
            pLVar5 = (LFQueue_Tail<density_tests::TestRuntimeTime<density::runtime_type<density::feature_list<density::f_size,_density::f_alignment,_density::f_copy_construct,_density::f_move_construct,_density::f_rtti,_density::f_destroy>_>_>,_density_tests::DeepTestAllocator<65536UL>,_(density::concurrency_cardinality)1,_(density::consistency_model)1>
                      *)(paVar7->super___atomic_base<unsigned_long>)._M_i;
            bVar3 = (LFQueue_Tail<density_tests::TestRuntimeTime<density::runtime_type<density::feature_list<density::f_size,_density::f_alignment,_density::f_copy_construct,_density::f_move_construct,_density::f_rtti,_density::f_destroy>_>_>,_density_tests::DeepTestAllocator<65536UL>,_(density::concurrency_cardinality)1,_(density::consistency_model)1>
                     *)pvVar2 == pLVar5;
            if (bVar3) {
              (paVar7->super___atomic_base<unsigned_long>)._M_i = (__int_type)pLVar1;
              pLVar5 = (LFQueue_Tail<density_tests::TestRuntimeTime<density::runtime_type<density::feature_list<density::f_size,_density::f_alignment,_density::f_copy_construct,_density::f_move_construct,_density::f_rtti,_density::f_destroy>_>_>,_density_tests::DeepTestAllocator<65536UL>,_(density::concurrency_cardinality)1,_(density::consistency_model)1>
                        *)pvVar2;
            }
            UNLOCK();
            if (!bVar3) {
              local_d8 = pLVar5;
            }
          }
          else if (mVar4 == memory_order_seq_cst) {
            LOCK();
            pLVar5 = (LFQueue_Tail<density_tests::TestRuntimeTime<density::runtime_type<density::feature_list<density::f_size,_density::f_alignment,_density::f_copy_construct,_density::f_move_construct,_density::f_rtti,_density::f_destroy>_>_>,_density_tests::DeepTestAllocator<65536UL>,_(density::concurrency_cardinality)1,_(density::consistency_model)1>
                      *)(paVar7->super___atomic_base<unsigned_long>)._M_i;
            bVar3 = (LFQueue_Tail<density_tests::TestRuntimeTime<density::runtime_type<density::feature_list<density::f_size,_density::f_alignment,_density::f_copy_construct,_density::f_move_construct,_density::f_rtti,_density::f_destroy>_>_>,_density_tests::DeepTestAllocator<65536UL>,_(density::concurrency_cardinality)1,_(density::consistency_model)1>
                     *)pvVar2 == pLVar5;
            if (bVar3) {
              (paVar7->super___atomic_base<unsigned_long>)._M_i = (__int_type)pLVar1;
              pLVar5 = (LFQueue_Tail<density_tests::TestRuntimeTime<density::runtime_type<density::feature_list<density::f_size,_density::f_alignment,_density::f_copy_construct,_density::f_move_construct,_density::f_rtti,_density::f_destroy>_>_>,_density_tests::DeepTestAllocator<65536UL>,_(density::concurrency_cardinality)1,_(density::consistency_model)1>
                        *)pvVar2;
            }
            UNLOCK();
            if (!bVar3) {
              local_d8 = pLVar5;
            }
          }
          else {
            LOCK();
            pLVar5 = (LFQueue_Tail<density_tests::TestRuntimeTime<density::runtime_type<density::feature_list<density::f_size,_density::f_alignment,_density::f_copy_construct,_density::f_move_construct,_density::f_rtti,_density::f_destroy>_>_>,_density_tests::DeepTestAllocator<65536UL>,_(density::concurrency_cardinality)1,_(density::consistency_model)1>
                      *)(paVar7->super___atomic_base<unsigned_long>)._M_i;
            bVar3 = (LFQueue_Tail<density_tests::TestRuntimeTime<density::runtime_type<density::feature_list<density::f_size,_density::f_alignment,_density::f_copy_construct,_density::f_move_construct,_density::f_rtti,_density::f_destroy>_>_>,_density_tests::DeepTestAllocator<65536UL>,_(density::concurrency_cardinality)1,_(density::consistency_model)1>
                     *)pvVar2 == pLVar5;
            if (bVar3) {
              (paVar7->super___atomic_base<unsigned_long>)._M_i = (__int_type)pLVar1;
              pLVar5 = (LFQueue_Tail<density_tests::TestRuntimeTime<density::runtime_type<density::feature_list<density::f_size,_density::f_alignment,_density::f_copy_construct,_density::f_move_construct,_density::f_rtti,_density::f_destroy>_>_>,_density_tests::DeepTestAllocator<65536UL>,_(density::concurrency_cardinality)1,_(density::consistency_model)1>
                        *)pvVar2;
            }
            UNLOCK();
            if (!bVar3) {
              local_d8 = pLVar5;
            }
          }
          break;
        case 3:
          if (mVar4 - memory_order_consume < 2) {
            LOCK();
            pLVar5 = (LFQueue_Tail<density_tests::TestRuntimeTime<density::runtime_type<density::feature_list<density::f_size,_density::f_alignment,_density::f_copy_construct,_density::f_move_construct,_density::f_rtti,_density::f_destroy>_>_>,_density_tests::DeepTestAllocator<65536UL>,_(density::concurrency_cardinality)1,_(density::consistency_model)1>
                      *)(paVar7->super___atomic_base<unsigned_long>)._M_i;
            bVar3 = (LFQueue_Tail<density_tests::TestRuntimeTime<density::runtime_type<density::feature_list<density::f_size,_density::f_alignment,_density::f_copy_construct,_density::f_move_construct,_density::f_rtti,_density::f_destroy>_>_>,_density_tests::DeepTestAllocator<65536UL>,_(density::concurrency_cardinality)1,_(density::consistency_model)1>
                     *)pvVar2 == pLVar5;
            if (bVar3) {
              (paVar7->super___atomic_base<unsigned_long>)._M_i = (__int_type)pLVar1;
              pLVar5 = (LFQueue_Tail<density_tests::TestRuntimeTime<density::runtime_type<density::feature_list<density::f_size,_density::f_alignment,_density::f_copy_construct,_density::f_move_construct,_density::f_rtti,_density::f_destroy>_>_>,_density_tests::DeepTestAllocator<65536UL>,_(density::concurrency_cardinality)1,_(density::consistency_model)1>
                        *)pvVar2;
            }
            UNLOCK();
            if (!bVar3) {
              local_d8 = pLVar5;
            }
          }
          else if (mVar4 == memory_order_seq_cst) {
            LOCK();
            pLVar5 = (LFQueue_Tail<density_tests::TestRuntimeTime<density::runtime_type<density::feature_list<density::f_size,_density::f_alignment,_density::f_copy_construct,_density::f_move_construct,_density::f_rtti,_density::f_destroy>_>_>,_density_tests::DeepTestAllocator<65536UL>,_(density::concurrency_cardinality)1,_(density::consistency_model)1>
                      *)(paVar7->super___atomic_base<unsigned_long>)._M_i;
            bVar3 = (LFQueue_Tail<density_tests::TestRuntimeTime<density::runtime_type<density::feature_list<density::f_size,_density::f_alignment,_density::f_copy_construct,_density::f_move_construct,_density::f_rtti,_density::f_destroy>_>_>,_density_tests::DeepTestAllocator<65536UL>,_(density::concurrency_cardinality)1,_(density::consistency_model)1>
                     *)pvVar2 == pLVar5;
            if (bVar3) {
              (paVar7->super___atomic_base<unsigned_long>)._M_i = (__int_type)pLVar1;
              pLVar5 = (LFQueue_Tail<density_tests::TestRuntimeTime<density::runtime_type<density::feature_list<density::f_size,_density::f_alignment,_density::f_copy_construct,_density::f_move_construct,_density::f_rtti,_density::f_destroy>_>_>,_density_tests::DeepTestAllocator<65536UL>,_(density::concurrency_cardinality)1,_(density::consistency_model)1>
                        *)pvVar2;
            }
            UNLOCK();
            if (!bVar3) {
              local_d8 = pLVar5;
            }
          }
          else {
            LOCK();
            pLVar5 = (LFQueue_Tail<density_tests::TestRuntimeTime<density::runtime_type<density::feature_list<density::f_size,_density::f_alignment,_density::f_copy_construct,_density::f_move_construct,_density::f_rtti,_density::f_destroy>_>_>,_density_tests::DeepTestAllocator<65536UL>,_(density::concurrency_cardinality)1,_(density::consistency_model)1>
                      *)(paVar7->super___atomic_base<unsigned_long>)._M_i;
            bVar3 = (LFQueue_Tail<density_tests::TestRuntimeTime<density::runtime_type<density::feature_list<density::f_size,_density::f_alignment,_density::f_copy_construct,_density::f_move_construct,_density::f_rtti,_density::f_destroy>_>_>,_density_tests::DeepTestAllocator<65536UL>,_(density::concurrency_cardinality)1,_(density::consistency_model)1>
                     *)pvVar2 == pLVar5;
            if (bVar3) {
              (paVar7->super___atomic_base<unsigned_long>)._M_i = (__int_type)pLVar1;
              pLVar5 = (LFQueue_Tail<density_tests::TestRuntimeTime<density::runtime_type<density::feature_list<density::f_size,_density::f_alignment,_density::f_copy_construct,_density::f_move_construct,_density::f_rtti,_density::f_destroy>_>_>,_density_tests::DeepTestAllocator<65536UL>,_(density::concurrency_cardinality)1,_(density::consistency_model)1>
                        *)pvVar2;
            }
            UNLOCK();
            if (!bVar3) {
              local_d8 = pLVar5;
            }
          }
          break;
        case 4:
          if (mVar4 - memory_order_consume < 2) {
            LOCK();
            pLVar5 = (LFQueue_Tail<density_tests::TestRuntimeTime<density::runtime_type<density::feature_list<density::f_size,_density::f_alignment,_density::f_copy_construct,_density::f_move_construct,_density::f_rtti,_density::f_destroy>_>_>,_density_tests::DeepTestAllocator<65536UL>,_(density::concurrency_cardinality)1,_(density::consistency_model)1>
                      *)(paVar7->super___atomic_base<unsigned_long>)._M_i;
            bVar3 = (LFQueue_Tail<density_tests::TestRuntimeTime<density::runtime_type<density::feature_list<density::f_size,_density::f_alignment,_density::f_copy_construct,_density::f_move_construct,_density::f_rtti,_density::f_destroy>_>_>,_density_tests::DeepTestAllocator<65536UL>,_(density::concurrency_cardinality)1,_(density::consistency_model)1>
                     *)pvVar2 == pLVar5;
            if (bVar3) {
              (paVar7->super___atomic_base<unsigned_long>)._M_i = (__int_type)pLVar1;
              pLVar5 = (LFQueue_Tail<density_tests::TestRuntimeTime<density::runtime_type<density::feature_list<density::f_size,_density::f_alignment,_density::f_copy_construct,_density::f_move_construct,_density::f_rtti,_density::f_destroy>_>_>,_density_tests::DeepTestAllocator<65536UL>,_(density::concurrency_cardinality)1,_(density::consistency_model)1>
                        *)pvVar2;
            }
            UNLOCK();
            if (!bVar3) {
              local_d8 = pLVar5;
            }
          }
          else if (mVar4 == memory_order_seq_cst) {
            LOCK();
            pLVar5 = (LFQueue_Tail<density_tests::TestRuntimeTime<density::runtime_type<density::feature_list<density::f_size,_density::f_alignment,_density::f_copy_construct,_density::f_move_construct,_density::f_rtti,_density::f_destroy>_>_>,_density_tests::DeepTestAllocator<65536UL>,_(density::concurrency_cardinality)1,_(density::consistency_model)1>
                      *)(paVar7->super___atomic_base<unsigned_long>)._M_i;
            bVar3 = (LFQueue_Tail<density_tests::TestRuntimeTime<density::runtime_type<density::feature_list<density::f_size,_density::f_alignment,_density::f_copy_construct,_density::f_move_construct,_density::f_rtti,_density::f_destroy>_>_>,_density_tests::DeepTestAllocator<65536UL>,_(density::concurrency_cardinality)1,_(density::consistency_model)1>
                     *)pvVar2 == pLVar5;
            if (bVar3) {
              (paVar7->super___atomic_base<unsigned_long>)._M_i = (__int_type)pLVar1;
              pLVar5 = (LFQueue_Tail<density_tests::TestRuntimeTime<density::runtime_type<density::feature_list<density::f_size,_density::f_alignment,_density::f_copy_construct,_density::f_move_construct,_density::f_rtti,_density::f_destroy>_>_>,_density_tests::DeepTestAllocator<65536UL>,_(density::concurrency_cardinality)1,_(density::consistency_model)1>
                        *)pvVar2;
            }
            UNLOCK();
            if (!bVar3) {
              local_d8 = pLVar5;
            }
          }
          else {
            LOCK();
            pLVar5 = (LFQueue_Tail<density_tests::TestRuntimeTime<density::runtime_type<density::feature_list<density::f_size,_density::f_alignment,_density::f_copy_construct,_density::f_move_construct,_density::f_rtti,_density::f_destroy>_>_>,_density_tests::DeepTestAllocator<65536UL>,_(density::concurrency_cardinality)1,_(density::consistency_model)1>
                      *)(paVar7->super___atomic_base<unsigned_long>)._M_i;
            bVar3 = (LFQueue_Tail<density_tests::TestRuntimeTime<density::runtime_type<density::feature_list<density::f_size,_density::f_alignment,_density::f_copy_construct,_density::f_move_construct,_density::f_rtti,_density::f_destroy>_>_>,_density_tests::DeepTestAllocator<65536UL>,_(density::concurrency_cardinality)1,_(density::consistency_model)1>
                     *)pvVar2 == pLVar5;
            if (bVar3) {
              (paVar7->super___atomic_base<unsigned_long>)._M_i = (__int_type)pLVar1;
              pLVar5 = (LFQueue_Tail<density_tests::TestRuntimeTime<density::runtime_type<density::feature_list<density::f_size,_density::f_alignment,_density::f_copy_construct,_density::f_move_construct,_density::f_rtti,_density::f_destroy>_>_>,_density_tests::DeepTestAllocator<65536UL>,_(density::concurrency_cardinality)1,_(density::consistency_model)1>
                        *)pvVar2;
            }
            UNLOCK();
            if (!bVar3) {
              local_d8 = pLVar5;
            }
          }
        }
        if (bVar3) {
          this_local = local_b8;
        }
        else {
          this_local = local_d8;
        }
      }
    }
  }
LAB_026e2af1:
  updated_tail._0_4_ = 1;
  PinGuard<density_tests::DeepTestAllocator<65536UL>,_(density::progress_guarantee)2>::~PinGuard
            ((PinGuard<density_tests::DeepTestAllocator<65536UL>,_(density::progress_guarantee)2> *)
             local_a0);
  return (ControlBlock *)this_local;
}

Assistant:

ControlBlock * get_or_allocate_next_page(
              LfQueue_ProgressGuarantee i_progress_guarantee, ControlBlock * const i_end_control)
            {
                DENSITY_ASSERT_INTERNAL(
                  i_end_control != 0 && address_is_aligned(i_end_control, s_alloc_granularity) &&
                  i_end_control == get_end_control_block(i_end_control));

                if (i_end_control != reinterpret_cast<ControlBlock *>(s_invalid_control_block))
                {
                    /* We are going to access the content of the end control, so we have to do a safe pin
                        (that is, pin the presumed tail, and then check if the tail has changed in the meanwhile). */
                    PinGuard<ALLOCATOR_TYPE, progress_lock_free> end_block(this);
                    auto const pin_result = end_block.pin(i_end_control);
                    if (pin_result == PinFailed)
                    {
                        return nullptr;
                    }
                    auto const updated_tail =
                      reinterpret_cast<ControlBlock *>(m_tail.load(mem_relaxed));
                    if (updated_tail != i_end_control)
                    {
                        return updated_tail;
                    }
                    // now the end control block is pinned, we can safely access it

                    // allocate and setup a new page
                    auto new_page = create_page(i_progress_guarantee);
                    if (new_page == nullptr)
                    {
                        return nullptr;
                    }

                    uintptr_t expected_next = LfQueue_InvalidNextPage;
                    if (!raw_atomic_compare_exchange_strong(
                          &i_end_control->m_next,
                          &expected_next,
                          reinterpret_cast<uintptr_t>(new_page) + LfQueue_Dead))
                    {
                        /* Some other thread has already linked a new page. We discard the page we
                            have just allocated. */
                        discard_created_page(new_page);

                        /* So i_end_control->m_next may now be the pointer to the next page
                            or 0 (if the page has been consumed in the meanwhile). */
                        if (expected_next == 0)
                        {
                            return updated_tail;
                        }

                        new_page =
                          reinterpret_cast<ControlBlock *>(expected_next & ~LfQueue_AllFlags);

                        DENSITY_ASSERT_INTERNAL(new_page != nullptr);
                        DENSITY_ASSUME_ALIGNED(new_page, ALLOCATOR_TYPE::page_alignment);
                    }

                    auto expected_tail = reinterpret_cast<uintptr_t>(i_end_control);
                    if (m_tail.compare_exchange_strong(
                          expected_tail, reinterpret_cast<uintptr_t>(new_page)))
                        return new_page;
                    else
                        return reinterpret_cast<ControlBlock *>(expected_tail);
                }
                else
                {
                    return create_initial_page(i_progress_guarantee);
                }
            }